

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O1

void Fra_FraigVerifyCounterEx(Fra_Man_t *p,Vec_Int_t *vCex)

{
  undefined1 *puVar1;
  byte *pbVar2;
  Aig_Man_t *pAVar3;
  void *pvVar4;
  long *plVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  long *plVar10;
  
  pAVar3 = p->pManAig;
  if (pAVar3->nObjs[2] != vCex->nSize) {
    __assert_fail("Aig_ManCiNum(p->pManAig) == Vec_IntSize(vCex)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCore.c"
                  ,0xbe,"void Fra_FraigVerifyCounterEx(Fra_Man_t *, Vec_Int_t *)");
  }
  lVar7 = (long)pAVar3->vObjs->nSize;
  if (0 < lVar7) {
    lVar9 = 0;
    do {
      pvVar4 = pAVar3->vObjs->pArray[lVar9];
      if ((pvVar4 != (void *)0x0) && ((*(byte *)((long)pvVar4 + 0x18) & 0x20) != 0)) {
        __assert_fail("!pObj->fMarkB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCore.c"
                      ,0xc1,"void Fra_FraigVerifyCounterEx(Fra_Man_t *, Vec_Int_t *)");
      }
      lVar9 = lVar9 + 1;
    } while (lVar7 != lVar9);
  }
  puVar1 = &pAVar3->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
  pVVar6 = p->pManAig->vCis;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      if (vCex->nSize <= lVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      *(ulong *)((long)pVVar6->pArray[lVar7] + 0x18) =
           *(ulong *)((long)pVVar6->pArray[lVar7] + 0x18) & 0xffffffffffffffdf |
           (ulong)((vCex->pArray[lVar7] & 1U) << 5);
      lVar7 = lVar7 + 1;
      pVVar6 = p->pManAig->vCis;
    } while (lVar7 < pVVar6->nSize);
  }
  pVVar6 = p->pManAig->vObjs;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      pvVar4 = pVVar6->pArray[lVar7];
      if ((pvVar4 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar4 + 0x18) & 7) - 7))
      {
        *(ulong *)((long)pvVar4 + 0x18) =
             *(ulong *)((long)pvVar4 + 0x18) & 0xffffffffffffffdf |
             (ulong)((((uint)*(ulong *)((long)pvVar4 + 0x10) ^
                      *(uint *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 5)
                      & ((uint)*(ulong *)((long)pvVar4 + 8) ^
                        *(uint *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x18) >> 5)
                     & 1) << 5);
      }
      lVar7 = lVar7 + 1;
      pVVar6 = p->pManAig->vObjs;
    } while (lVar7 < pVVar6->nSize);
  }
  pVVar6 = p->pManAig->vCos;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      pvVar4 = pVVar6->pArray[lVar7];
      *(ulong *)((long)pvVar4 + 0x18) =
           *(ulong *)((long)pvVar4 + 0x18) & 0xffffffffffffffdf |
           (ulong)(((int)*(ulong *)((long)pvVar4 + 8) << 5 ^
                   *(uint *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20);
      lVar7 = lVar7 + 1;
      pVVar6 = p->pManAig->vCos;
    } while (lVar7 < pVVar6->nSize);
  }
  pVVar6 = p->pCla->vClasses1;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      uVar8 = *(uint *)((long)pVVar6->pArray[lVar7] + 0x18);
      if (((uVar8 >> 5 ^ uVar8 >> 3) & 1) != 0) {
        printf("The node %d is not constant under cex!\n",
               (ulong)*(uint *)((long)pVVar6->pArray[lVar7] + 0x24));
      }
      lVar7 = lVar7 + 1;
      pVVar6 = p->pCla->vClasses1;
    } while (lVar7 < pVVar6->nSize);
  }
  pVVar6 = p->pCla->vClasses;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      plVar5 = (long *)pVVar6->pArray[lVar7];
      lVar9 = plVar5[1];
      if (lVar9 != 0) {
        plVar10 = plVar5 + 2;
        do {
          uVar8 = *(uint *)(lVar9 + 0x18) ^ *(uint *)(*plVar5 + 0x18);
          if (((uVar8 >> 5 ^ uVar8 >> 3) & 1) != 0) {
            printf("The nodes %d and %d are not equal under cex!\n",(ulong)*(uint *)(*plVar5 + 0x24)
                   ,(ulong)*(uint *)(lVar9 + 0x24));
          }
          lVar9 = *plVar10;
          plVar10 = plVar10 + 1;
        } while (lVar9 != 0);
      }
      lVar7 = lVar7 + 1;
      pVVar6 = p->pCla->vClasses;
    } while (lVar7 < pVVar6->nSize);
  }
  pVVar6 = p->pManAig->vObjs;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      if (pVVar6->pArray[lVar7] != (void *)0x0) {
        pbVar2 = (byte *)((long)pVVar6->pArray[lVar7] + 0x18);
        *pbVar2 = *pbVar2 & 0xdf;
      }
      lVar7 = lVar7 + 1;
      pVVar6 = p->pManAig->vObjs;
    } while (lVar7 < pVVar6->nSize);
  }
  return;
}

Assistant:

void Fra_FraigVerifyCounterEx( Fra_Man_t * p, Vec_Int_t * vCex )
{
    Aig_Obj_t * pObj, ** ppClass;
    int i, c;
    assert( Aig_ManCiNum(p->pManAig) == Vec_IntSize(vCex) );
    // make sure the input pattern is not used
    Aig_ManForEachObj( p->pManAig, pObj, i )
        assert( !pObj->fMarkB );
    // simulate the cex through the AIG
    Aig_ManConst1(p->pManAig)->fMarkB = 1;
    Aig_ManForEachCi( p->pManAig, pObj, i )
        pObj->fMarkB = Vec_IntEntry(vCex, i);
    Aig_ManForEachNode( p->pManAig, pObj, i )
        pObj->fMarkB = (Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj)) & 
                       (Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj));
    Aig_ManForEachCo( p->pManAig, pObj, i )
        pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj);
    // check if the classes hold
    Vec_PtrForEachEntry( Aig_Obj_t *, p->pCla->vClasses1, pObj, i )
    {
        if ( pObj->fPhase != pObj->fMarkB )
            printf( "The node %d is not constant under cex!\n", pObj->Id );
    }
    Vec_PtrForEachEntry( Aig_Obj_t **, p->pCla->vClasses, ppClass, i )
    {
        for ( c = 1; ppClass[c]; c++ )
            if ( (ppClass[0]->fPhase ^ ppClass[c]->fPhase) != (ppClass[0]->fMarkB ^ ppClass[c]->fMarkB) )
                printf( "The nodes %d and %d are not equal under cex!\n", ppClass[0]->Id, ppClass[c]->Id );
//        for ( c = 0; ppClass[c]; c++ )
//            if ( Fra_ObjFraig(ppClass[c],p->pPars->nFramesK) == Aig_ManConst1(p->pManFraig) )
//                printf( "A member of non-constant class has a constant repr!\n" );
    }
    // clean the simulation pattern
    Aig_ManForEachObj( p->pManAig, pObj, i )
        pObj->fMarkB = 0;
}